

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O2

bool __thiscall
magic_enum::containers::
bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::test
          (bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
           *this,Color pos)

{
  out_of_range *this_00;
  enable_if_t<Color,_optional<std::size_t>_> eVar1;
  
  eVar1 = enum_index<Color,(magic_enum::detail::enum_subtype)1>(pos);
  if (((undefined1  [16])
       eVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    return (this[eVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload >> 3].a._M_elems[0] >>
            (eVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._0_4_ & 7) & 1) != 0;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,"magic_enum::containers::bitset::test: Unrecognized position");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

constexpr bool test(E pos) const {
    if (auto i = index_type::at(pos)) {
      return static_cast<bool>(const_reference(this, *i));
    }
    MAGIC_ENUM_THROW(std::out_of_range("magic_enum::containers::bitset::test: Unrecognized position"));
  }